

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::setLogCallback
          (Highs *this,_func_void_HighsLogType_char_ptr_void_ptr *user_log_callback,
          void *user_log_callback_data)

{
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"setLogCallback",&local_59);
  std::__cxx11::string::string((string *)&local_58,"setCallback",&local_5a);
  deprecationMessage(this,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->options_).super_HighsOptionsStruct.log_options.user_log_callback = user_log_callback;
  (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data =
       user_log_callback_data;
  return kOk;
}

Assistant:

HighsStatus Highs::setLogCallback(void (*user_log_callback)(HighsLogType,
                                                            const char*, void*),
                                  void* user_log_callback_data) {
  deprecationMessage("setLogCallback", "setCallback");
  options_.log_options.user_log_callback = user_log_callback;
  options_.log_options.user_log_callback_data = user_log_callback_data;
  return HighsStatus::kOk;
}